

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Sym * find_global_D_Sym(D_Scope *st,char *name,char *end)

{
  D_Scope *pDVar1;
  D_Scope *cur;
  uint h;
  size_t sVar2;
  D_Sym *pDVar3;
  D_Sym *pDVar4;
  int l;
  
  if (end == (char *)0x0) {
    sVar2 = strlen(name);
    l = (int)sVar2;
  }
  else {
    l = (int)end - (int)name;
  }
  h = strhashl(name,l);
  pDVar1 = st->up;
  cur = st;
  while (pDVar1 != (D_Scope *)0x0) {
    cur = cur->search;
    pDVar1 = cur->up;
  }
  pDVar3 = find_D_Sym_internal(cur,name,l,h);
  if (pDVar3 == (D_Sym *)0x0) {
    pDVar4 = (D_Sym *)0x0;
  }
  else {
    pDVar4 = pDVar3->update_of;
    if (pDVar3->update_of == (D_Sym *)0x0) {
      pDVar4 = pDVar3;
    }
    for (; st != (D_Scope *)0x0; st = st->up_updates) {
      for (pDVar3 = st->updates; pDVar3 != (D_Sym *)0x0; pDVar3 = pDVar3->next) {
        if (pDVar3->update_of == pDVar4) {
          return pDVar3;
        }
      }
    }
  }
  return pDVar4;
}

Assistant:

D_Sym *find_global_D_Sym(D_Scope *st, char *name, char *end) {
  D_Sym *s;
  uint len = end ? end - name : strlen(name);
  uint h = strhashl(name, len);
  D_Scope *cur = st;
  while (cur->up) cur = cur->search;
  s = find_D_Sym_internal(cur, name, len, h);
  if (s) return current_D_Sym(st, s);
  return NULL;
}